

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_submit.c
# Opt level: O2

int nghttp2_session_set_local_window_size
              (nghttp2_session *session,uint8_t flags,int32_t stream_id,int32_t window_size)

{
  int iVar1;
  nghttp2_stream *stream;
  int32_t *recv_reduction_ptr;
  int32_t *recv_window_size_ptr;
  int32_t *piVar2;
  int32_t window_size_increment;
  
  if (window_size < 0) {
    return -0x1f5;
  }
  if (stream_id == 0) {
    window_size_increment = window_size - session->local_window_size;
    if (window_size_increment == 0) {
      return 0;
    }
    piVar2 = &session->local_window_size;
    recv_window_size_ptr = &session->recv_window_size;
    recv_reduction_ptr = &session->recv_reduction;
    if (window_size_increment < 0) goto LAB_00595769;
    iVar1 = nghttp2_increase_local_window_size
                      (piVar2,recv_window_size_ptr,recv_reduction_ptr,&window_size_increment);
    if (iVar1 != 0) {
      return iVar1;
    }
    if (window_size_increment < 1) {
      iVar1 = nghttp2_session_update_recv_connection_window_size(session,0);
      return iVar1;
    }
    stream_id = 0;
  }
  else {
    stream = nghttp2_session_get_stream(session,stream_id);
    if (stream == (nghttp2_stream *)0x0) {
      return 0;
    }
    window_size_increment = window_size - stream->local_window_size;
    if (window_size_increment == 0) {
      return 0;
    }
    piVar2 = &stream->local_window_size;
    recv_window_size_ptr = &stream->recv_window_size;
    recv_reduction_ptr = &stream->recv_reduction;
    if (window_size_increment < 0) {
LAB_00595769:
      iVar1 = nghttp2_adjust_local_window_size
                        (piVar2,recv_window_size_ptr,recv_reduction_ptr,&window_size_increment);
      return iVar1;
    }
    iVar1 = nghttp2_increase_local_window_size
                      (piVar2,recv_window_size_ptr,recv_reduction_ptr,&window_size_increment);
    if (iVar1 != 0) {
      return iVar1;
    }
    if (window_size_increment < 1) {
      iVar1 = nghttp2_session_update_recv_stream_window_size(session,stream,0,1);
      return iVar1;
    }
  }
  iVar1 = nghttp2_session_add_window_update(session,'\0',stream_id,window_size_increment);
  return iVar1;
}

Assistant:

int nghttp2_session_set_local_window_size(nghttp2_session *session,
                                          uint8_t flags, int32_t stream_id,
                                          int32_t window_size) {
  int32_t window_size_increment;
  nghttp2_stream *stream;
  int rv;
  (void)flags;

  if (window_size < 0) {
    return NGHTTP2_ERR_INVALID_ARGUMENT;
  }

  if (stream_id == 0) {
    window_size_increment = window_size - session->local_window_size;

    if (window_size_increment == 0) {
      return 0;
    }

    if (window_size_increment < 0) {
      return nghttp2_adjust_local_window_size(
          &session->local_window_size, &session->recv_window_size,
          &session->recv_reduction, &window_size_increment);
    }

    rv = nghttp2_increase_local_window_size(
        &session->local_window_size, &session->recv_window_size,
        &session->recv_reduction, &window_size_increment);

    if (rv != 0) {
      return rv;
    }

    if (window_size_increment > 0) {
      return nghttp2_session_add_window_update(session, 0, stream_id,
                                               window_size_increment);
    }

    return nghttp2_session_update_recv_connection_window_size(session, 0);
  } else {
    stream = nghttp2_session_get_stream(session, stream_id);

    if (stream == NULL) {
      return 0;
    }

    window_size_increment = window_size - stream->local_window_size;

    if (window_size_increment == 0) {
      return 0;
    }

    if (window_size_increment < 0) {
      return nghttp2_adjust_local_window_size(
          &stream->local_window_size, &stream->recv_window_size,
          &stream->recv_reduction, &window_size_increment);
    }

    rv = nghttp2_increase_local_window_size(
        &stream->local_window_size, &stream->recv_window_size,
        &stream->recv_reduction, &window_size_increment);

    if (rv != 0) {
      return rv;
    }

    if (window_size_increment > 0) {
      return nghttp2_session_add_window_update(session, 0, stream_id,
                                               window_size_increment);
    }

    return nghttp2_session_update_recv_stream_window_size(session, stream, 0,
                                                          1);
  }
}